

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_wallmarks.cxx
# Opt level: O0

void __thiscall read_slot_1::operator()(read_slot_1 *this,wm_slot_le **_slot,xr_reader *r)

{
  uint32_t uVar1;
  wm_slot_le *this_00;
  size_t n;
  wm_slot_le *slot;
  xr_reader *r_local;
  wm_slot_le **_slot_local;
  read_slot_1 *this_local;
  
  this_00 = (wm_slot_le *)operator_new(0x58);
  xray_re::wm_slot_le::wm_slot_le(this_00);
  *_slot = this_00;
  uVar1 = xray_re::xr_reader::r_u32(r);
  xray_re::xr_reader::r_sz(r,(string *)this_00);
  xray_re::xr_reader::r_sz(r,&this_00->texture);
  xray_re::xr_reader::
  r_seq<std::vector<xray_re::wm_object,std::allocator<xray_re::wm_object>>,read_wallmark>
            (r,uVar1,&this_00->wallmarks);
  return;
}

Assistant:

void operator()(wm_slot_le*& _slot, xr_reader& r) const {
	wm_slot_le* slot = new wm_slot_le;
	_slot = slot;
	size_t n = r.r_u32();
	r.r_sz(slot->shader);
	r.r_sz(slot->texture);
	r.r_seq(n, slot->wallmarks, read_wallmark());
}